

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::ListBoxHeader(char *label,int items_count,int height_in_items)

{
  bool bVar1;
  int in_EDX;
  int in_ESI;
  float fVar2;
  ImVec2 size;
  float height_in_items_f;
  ImGuiStyle *style;
  ImVec2 *in_stack_000000a0;
  char *in_stack_000000a8;
  float local_28;
  ImVec2 local_24;
  float local_1c;
  ImGuiStyle *local_18;
  int local_10;
  int local_c;
  
  local_10 = in_EDX;
  local_c = in_ESI;
  if (in_EDX < 0) {
    local_10 = ImMin<int>(in_ESI,7);
  }
  local_18 = GetStyle();
  if (local_10 < local_c) {
    local_28 = (float)local_10 + 0.25;
  }
  else {
    local_28 = (float)local_10 + 0.0;
  }
  local_1c = local_28;
  ImVec2::ImVec2(&local_24);
  local_24.x = 0.0;
  fVar2 = GetTextLineHeightWithSpacing();
  local_24.y = ImFloor(fVar2 * local_1c + (local_18->FramePadding).y * 2.0);
  bVar1 = ListBoxHeader(in_stack_000000a8,in_stack_000000a0);
  return bVar1;
}

Assistant:

bool ImGui::ListBoxHeader(const char* label, int items_count, int height_in_items)
{
    // Size default to hold ~7.25 items.
    // We add +25% worth of item height to allow the user to see at a glance if there are more items up/down, without looking at the scrollbar.
    // We don't add this extra bit if items_count <= height_in_items. It is slightly dodgy, because it means a dynamic list of items will make the widget resize occasionally when it crosses that size.
    // I am expecting that someone will come and complain about this behavior in a remote future, then we can advise on a better solution.
    if (height_in_items < 0)
        height_in_items = ImMin(items_count, 7);
    const ImGuiStyle& style = GetStyle();
    float height_in_items_f = (height_in_items < items_count) ? (height_in_items + 0.25f) : (height_in_items + 0.00f);

    // We include ItemSpacing.y so that a list sized for the exact number of items doesn't make a scrollbar appears. We could also enforce that by passing a flag to BeginChild().
    ImVec2 size;
    size.x = 0.0f;
    size.y = ImFloor(GetTextLineHeightWithSpacing() * height_in_items_f + style.FramePadding.y * 2.0f);
    return ListBoxHeader(label, size);
}